

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseGenericSelectionExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  GenericSelectionExpressionSyntax *pGVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == Keyword__Generic) {
    pGVar3 = makeNode<psy::C::GenericSelectionExpressionSyntax>(this);
    *expr = &pGVar3->super_ExpressionSyntax;
    IVar4 = consume(this);
    pGVar3->genericKwTkIdx_ = IVar4;
    bVar1 = match(this,OpenParenToken,&pGVar3->openParenTkIdx_);
    if (bVar1) {
      bVar1 = parseExpressionWithPrecedenceCast(this,&pGVar3->expr_);
      if (bVar1) {
        bVar1 = parseNAryExpression_AtOperator(this,&pGVar3->expr_,'\x02');
        if (bVar1) {
          bVar1 = match(this,CommaToken,&pGVar3->commaTkIdx_);
          if (bVar1) {
            bVar1 = parseCommaSeparatedItems<psy::C::GenericAssociationSyntax,psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax*>>
                              (this,&pGVar3->assocs_,0x2c045c);
            if (bVar1) {
              bVar1 = matchOrSkipTo(this,CloseParenToken,&pGVar3->closeParenTkIdx_);
              return bVar1;
            }
          }
        }
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x106);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"assert failure: `_Generic\'",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Parser::parseGenericSelectionExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword__Generic,
                  return false,
                  "assert failure: `_Generic'");

    auto selExpr = makeNode<GenericSelectionExpressionSyntax>();
    expr = selExpr;
    selExpr->genericKwTkIdx_ = consume();

    return match(SyntaxKind::OpenParenToken, &selExpr->openParenTkIdx_)
            && parseExpressionWithPrecedenceAssignment(selExpr->expr_)
            && match(SyntaxKind::CommaToken, &selExpr->commaTkIdx_)
            && parseGenericAssociationList(selExpr->assocs_)
            && matchOrSkipTo(SyntaxKind::CloseParenToken, &selExpr->closeParenTkIdx_);
}